

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

bool __thiscall WndRect::keepOnScreen(WndRect *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  WndRect screen;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  XPLMGetScreenBoundsGlobal(&local_28,(long)&local_28 + 4,&uStack_20,(long)&uStack_20 + 4);
  iVar2 = (this->br).x;
  if ((int)uStack_20 < iVar2) {
    (this->tl).x = (this->tl).x + ((int)uStack_20 - iVar2);
    (this->br).x = (int)uStack_20;
  }
  iVar3 = (this->tl).x;
  iVar6 = (int)local_28 - iVar3;
  if (iVar6 != 0 && iVar3 <= (int)local_28) {
    (this->tl).x = (int)local_28;
    (this->br).x = (this->br).x + iVar6;
  }
  iVar4 = (this->br).y;
  iVar7 = uStack_20._4_4_ - iVar4;
  if (iVar7 != 0 && iVar4 <= uStack_20._4_4_) {
    piVar1 = &(this->tl).y;
    *piVar1 = *piVar1 + iVar7;
    (this->br).y = uStack_20._4_4_;
  }
  local_28._4_4_ = local_28._4_4_ + -0x32;
  iVar5 = (this->tl).y;
  if (local_28._4_4_ < iVar5) {
    (this->tl).y = local_28._4_4_;
    piVar1 = &(this->br).y;
    *piVar1 = *piVar1 + (local_28._4_4_ - iVar5);
  }
  return local_28._4_4_ < iVar5 ||
         (iVar7 != 0 && iVar4 <= uStack_20._4_4_ ||
         (iVar6 != 0 && iVar3 <= (int)local_28 || (int)uStack_20 < iVar2));
}

Assistant:

bool WndRect::keepOnScreen ()
{
    bool bChanged = false;
    WndRect screen;
    XPLMGetScreenBoundsGlobal(&screen.left(), &screen.top(),
                              &screen.right(), &screen.bottom());


    if (right() > screen.right()) {
        shift(screen.right() - right(), 0);
        bChanged = true;
    }
    if (left() < screen.left()) {
        shift(screen.left() - left(), 0);
        bChanged = true;
    }
    if (bottom() < screen.bottom()) {
        shift(0, screen.bottom() - bottom());
        bChanged = true;
    }
    if (top() > screen.top() - WIN_FROM_TOP) {
        shift(0, screen.top() - WIN_FROM_TOP - top());
        bChanged = true;
    }
    // Did we change any value?
    return bChanged;
}